

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O3

void __thiscall
duckdb::StreamingWindowState::AggregateState::Execute
          (AggregateState *this,ExecutionContext *context,DataChunk *input,Vector *result)

{
  SelectionVector *sel_00;
  DataChunk *pDVar1;
  DataChunk *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  sel_t *psVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  _func_int **__n;
  Vector *pVVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  iterator iVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  unsigned_long uVar11;
  pointer this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  reference pvVar13;
  VectorBuffer *pVVar14;
  reference pvVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  ulong uVar17;
  long lVar18;
  _Head_base<0UL,_unsigned_long_*,_false> _Var19;
  SelectionVector sel;
  vector<unsigned_long,_true> structs;
  AggregateInputData aggr_input_data;
  sel_t s;
  SelectionVector local_f8;
  _Head_base<0UL,_unsigned_long_*,_false> local_d8;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> sStack_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  iterator iStack_b0;
  unsigned_long *local_a8;
  DataChunk *local_98;
  AggregateInputData local_90;
  _Head_base<0UL,_unsigned_long_*,_false> local_78;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> sStack_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  SelectionVector *local_58;
  Vector *local_50;
  type local_48;
  AggregateState *local_40;
  undefined4 local_34;
  
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)input->count;
  local_50 = result;
  local_48 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
             ::operator*(&this->wexpr->aggregate);
  local_78._M_head_impl = (unsigned_long *)0x0;
  sStack_70.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sStack_70.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
  sel_00 = &this->filter_sel;
  p_Var9 = p_Var2;
  if (((Expression *)
       (this->wexpr->filter_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false> != (Expression *)0x0) &&
     (p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ExpressionExecutor::SelectExpression(&this->filter_executor,input,sel_00),
     p_Var9 < p_Var2)) {
    local_f8.sel_vector = (sel_t *)p_Var2;
    local_60 = p_Var2;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_d8,(unsigned_long *)&local_f8);
    _Var7._M_pi = sStack_70.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    sStack_70.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         sStack_d0.internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    sStack_70.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_d8;
    local_d8._M_head_impl = (unsigned_long *)0x0;
    sStack_d0.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    if ((_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       sStack_d0.internal.
       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 sStack_d0.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
    pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(&sStack_70)
    ;
    _Var19._M_head_impl =
         (pTVar10->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    if (_Var19._M_head_impl == (unsigned_long *)0x0) {
      local_f8.sel_vector = (sel_t *)local_60;
      local_78._M_head_impl = _Var19._M_head_impl;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_d8,(unsigned_long *)&local_f8);
      _Var7._M_pi = sStack_70.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      sStack_70.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           sStack_d0.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      sStack_70.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_d8;
      local_d8._M_head_impl = (unsigned_long *)0x0;
      sStack_d0.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      if ((_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         sStack_d0.internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   sStack_d0.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&sStack_70);
      _Var19._M_head_impl =
           (pTVar10->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    }
    uVar17 = (ulong)((long)&p_Var2[3]._M_weak_count + 3U) >> 6;
    local_78._M_head_impl = _Var19._M_head_impl;
    if (uVar17 != 1) {
      switchD_012e3010::default(_Var19._M_head_impl,0,uVar17 * 8 - 8);
    }
    uVar11 = -1L << ((byte)p_Var2 & 0x3f);
    if (((ulong)p_Var2 & 0x3f) == 0) {
      uVar11 = 0;
    }
    _Var19._M_head_impl[uVar17 - 1] = uVar11;
    if (p_Var9 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      psVar3 = sel_00->sel_vector;
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        p_Var16 = p_Var12;
        if (psVar3 != (sel_t *)0x0) {
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)psVar3[(long)p_Var12];
        }
        _Var19._M_head_impl[(ulong)p_Var16 >> 6] =
             _Var19._M_head_impl[(ulong)p_Var16 >> 6] | 1L << ((byte)p_Var16 & 0x3f);
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&p_Var12->_vptr__Sp_counted_base + 1);
      } while (p_Var9 != p_Var12);
    }
  }
  if ((this->wexpr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->wexpr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pdVar4 = local_50->data;
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        if (local_78._M_head_impl == (unsigned_long *)0x0) {
          uVar17 = 1;
        }
        else {
          uVar17 = (ulong)((local_78._M_head_impl[(ulong)p_Var9 >> 6] >> ((ulong)p_Var9 & 0x3f) & 1)
                          != 0);
        }
        lVar18 = uVar17 + this->unfiltered;
        this->unfiltered = lVar18;
        *(long *)(pdVar4 + (long)p_Var9 * 8) = lVar18;
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var9->_vptr__Sp_counted_base + 1);
      } while (p_Var2 != p_Var9);
    }
  }
  else {
    pDVar1 = &this->arg_chunk;
    ExpressionExecutor::Execute(&this->executor,input,pDVar1);
    DataChunk::Flatten(pDVar1);
    local_d8._M_head_impl = (unsigned_long *)0x0;
    sStack_d0.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    sStack_d0.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
    local_98 = pDVar1;
    if ((this->distinct).
        super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
        .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl !=
        (GroupedAggregateHashTable *)0x0) {
      this_00 = &this->distinct_args;
      DataChunk::Reference(this_00,pDVar1);
      if ((Expression *)
          (this->wexpr->filter_expr).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> != (Expression *)0x0) {
        DataChunk::Slice(this_00,sel_00,(idx_t)p_Var9);
      }
      local_58 = &this->distinct_sel;
      if (p_Var9 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        DataChunk::Hash(this_00,&this->hashes);
        this_01 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                  ::operator->(&this->distinct);
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  GroupedAggregateHashTable::FindOrCreateGroups
                            (this_01,this_00,&this->hashes,&this->addresses,local_58);
      }
      if (p_Var12 < p_Var9) {
        local_c0 = p_Var2;
        local_b8 = p_Var2;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_f8,(unsigned_long *)&local_b8);
        _Var7._M_pi = sStack_d0.internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        sStack_d0.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_f8.selection_data.internal.
             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        sStack_d0.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_f8.sel_vector;
        local_f8.sel_vector = (sel_t *)0x0;
        local_f8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        if ((_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_f8.selection_data.internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_f8.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            (&sStack_d0);
        _Var19._M_head_impl =
             (pTVar10->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        if (_Var19._M_head_impl == (unsigned_long *)0x0) {
          local_b8 = local_c0;
          local_d8._M_head_impl = _Var19._M_head_impl;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_f8,(unsigned_long *)&local_b8);
          _Var7._M_pi = sStack_d0.internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          sStack_d0.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_f8.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          sStack_d0.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)local_f8.sel_vector;
          local_f8.sel_vector = (sel_t *)0x0;
          local_f8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          if ((_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_f8.selection_data.internal.
             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_f8.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&sStack_d0);
          _Var19._M_head_impl =
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        local_d8._M_head_impl = _Var19._M_head_impl;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          uVar17 = (ulong)((long)&p_Var2[3]._M_weak_count + 3U) >> 6;
          if (uVar17 != 1) {
            switchD_012e3010::default(_Var19._M_head_impl,0,uVar17 * 8 - 8);
          }
          uVar11 = -1L << ((byte)p_Var2 & 0x3f);
          if (((ulong)p_Var2 & 0x3f) == 0) {
            uVar11 = 0;
          }
          _Var19._M_head_impl[uVar17 - 1] = uVar11;
        }
        if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          psVar3 = local_58->sel_vector;
          psVar5 = sel_00->sel_vector;
          p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          do {
            p_Var16 = p_Var9;
            if (psVar3 != (sel_t *)0x0) {
              p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)psVar3[(long)p_Var9];
            }
            if (psVar5 != (sel_t *)0x0) {
              p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)psVar5[(long)p_Var16]
              ;
            }
            if (_Var19._M_head_impl != (unsigned_long *)0x0) {
              _Var19._M_head_impl[(ulong)p_Var16 >> 6] =
                   _Var19._M_head_impl[(ulong)p_Var16 >> 6] | 1L << ((byte)p_Var16 & 0x3f);
            }
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&p_Var9->_vptr__Sp_counted_base + 1);
          } while (p_Var12 != p_Var9);
        }
      }
    }
    local_f8.sel_vector = &local_34;
    local_34 = 0;
    local_f8.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_f8.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pDVar1 = &this->arg_cursor;
    DataChunk::Reset(pDVar1);
    DataChunk::Slice(pDVar1,&local_f8,1);
    local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iStack_b0._M_current = (unsigned_long *)0x0;
    local_a8 = (unsigned_long *)0x0;
    local_90.bind_data.ptr = (FunctionData *)0x0;
    if ((this->arg_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->arg_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        pvVar13 = vector<duckdb::Vector,_true>::operator[]
                            (&pDVar1->data,(size_type)local_90.bind_data.ptr);
        DictionaryVector::VerifyDictionary(pvVar13);
        pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar13->auxiliary);
        pvVar15 = vector<duckdb::Vector,_true>::operator[]
                            (&local_98->data,(size_type)local_90.bind_data.ptr);
        Vector::Reference((Vector *)(pVVar14 + 1),pvVar15);
        if ((pvVar13->type).physical_type_ == STRUCT) {
          if (iStack_b0._M_current == local_a8) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,iStack_b0,
                       (unsigned_long *)&local_90);
          }
          else {
            *iStack_b0._M_current = (unsigned_long)local_90.bind_data.ptr;
            iStack_b0._M_current = iStack_b0._M_current + 1;
          }
        }
        local_90.bind_data.ptr =
             (FunctionData *)((long)&(local_90.bind_data.ptr)->_vptr_FunctionData + 1);
      } while (local_90.bind_data.ptr <
               (FunctionData *)
               (((long)(this->arg_chunk).data.
                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->arg_chunk).data.
                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5));
    }
    local_90.bind_data.ptr =
         (this->wexpr->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    local_90.allocator = &this->arena_allocator;
    local_90.combine_type = PRESERVE_INPUT;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_40 = this;
      do {
        iVar8._M_current = iStack_b0._M_current;
        *(int *)(_func_int ***)local_f8.sel_vector = (int)p_Var9;
        for (p_Var12 = local_b8;
            p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar8._M_current;
            p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var12->_M_use_count) {
          __n = p_Var12->_vptr__Sp_counted_base;
          pvVar13 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,(size_type)__n);
          pvVar15 = vector<duckdb::Vector,_true>::operator[](&local_98->data,(size_type)__n);
          Vector::Slice(pvVar13,pvVar15,&local_f8,1);
        }
        if (((local_78._M_head_impl == (unsigned_long *)0x0) ||
            ((local_78._M_head_impl[(ulong)p_Var9 >> 6] >> ((ulong)p_Var9 & 0x3f) & 1) != 0)) &&
           (((element_type *)local_d8._M_head_impl == (element_type *)0x0 ||
            (((ulong)(((element_type *)(local_d8._M_head_impl + ((ulong)p_Var9 >> 6)))->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false> >> ((ulong)p_Var9 & 0x3f) & 1) !=
             0)))) {
          pVVar6 = (local_40->arg_cursor).data.
                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start;
          (*local_48->update)(pVVar6,&local_90,
                              ((long)(local_40->arg_cursor).data.
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6 >> 3)
                              * 0x4ec4ec4ec4ec4ec5,&this->statev,1);
        }
        (*local_48->finalize)(&this->statev,&local_90,local_50,1,(idx_t)p_Var9);
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var9->_vptr__Sp_counted_base + 1);
      } while (p_Var9 != p_Var2);
    }
    if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete(local_b8);
    }
    if (local_f8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (sStack_d0.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sStack_d0.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if (sStack_70.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_70.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void StreamingWindowState::AggregateState::Execute(ExecutionContext &context, DataChunk &input, Vector &result) {
	//	Establish the aggregation environment
	const idx_t count = input.size();
	auto &aggregate = *wexpr.aggregate;
	auto &aggr_state = *this;
	auto &statev = aggr_state.statev;

	// Compute the FILTER mask (if any)
	ValidityMask filter_mask;
	auto filtered = count;
	auto &filter_sel = aggr_state.filter_sel;
	if (wexpr.filter_expr) {
		filtered = filter_executor.SelectExpression(input, filter_sel);
		if (filtered < count) {
			filter_mask.Initialize(count);
			filter_mask.SetAllInvalid(count);
			for (idx_t f = 0; f < filtered; ++f) {
				filter_mask.SetValid(filter_sel.get_index(f));
			}
		}
	}

	// Check for COUNT(*)
	if (wexpr.children.empty()) {
		D_ASSERT(GetTypeIdSize(result.GetType().InternalType()) == sizeof(int64_t));
		auto data = FlatVector::GetData<int64_t>(result);
		auto &unfiltered = aggr_state.unfiltered;
		for (idx_t i = 0; i < count; ++i) {
			unfiltered += int64_t(filter_mask.RowIsValid(i));
			data[i] = unfiltered;
		}
		return;
	}

	// Compute the arguments
	auto &arg_chunk = aggr_state.arg_chunk;
	executor.Execute(input, arg_chunk);
	arg_chunk.Flatten();

	// Update the distinct hash table
	ValidityMask distinct_mask;
	if (aggr_state.distinct) {
		auto &distinct_args = aggr_state.distinct_args;
		distinct_args.Reference(arg_chunk);
		if (wexpr.filter_expr) {
			distinct_args.Slice(filter_sel, filtered);
		}
		idx_t distinct = 0;
		auto &distinct_sel = aggr_state.distinct_sel;
		if (filtered) {
			// FindOrCreateGroups assumes non-empty input
			auto &hashes = aggr_state.hashes;
			distinct_args.Hash(hashes);

			auto &addresses = aggr_state.addresses;
			distinct = aggr_state.distinct->FindOrCreateGroups(distinct_args, hashes, addresses, distinct_sel);
		}

		//	Translate the distinct selection from filtered row numbers
		//	back to input row numbers. We need to produce output for all input rows,
		//	so we filter out
		if (distinct < filtered) {
			distinct_mask.Initialize(count);
			distinct_mask.SetAllInvalid(count);
			for (idx_t d = 0; d < distinct; ++d) {
				const auto f = distinct_sel.get_index(d);
				distinct_mask.SetValid(filter_sel.get_index(f));
			}
		}
	}

	// Iterate through them using a single SV
	sel_t s = 0;
	SelectionVector sel(&s);
	auto &arg_cursor = aggr_state.arg_cursor;
	arg_cursor.Reset();
	arg_cursor.Slice(sel, 1);
	// This doesn't work for STRUCTs because the SV
	// is not copied to the children when you slice
	vector<column_t> structs;
	for (column_t col_idx = 0; col_idx < arg_chunk.ColumnCount(); ++col_idx) {
		auto &col_vec = arg_cursor.data[col_idx];
		DictionaryVector::Child(col_vec).Reference(arg_chunk.data[col_idx]);
		if (col_vec.GetType().InternalType() == PhysicalType::STRUCT) {
			structs.emplace_back(col_idx);
		}
	}

	// Update the state and finalize it one row at a time.
	AggregateInputData aggr_input_data(wexpr.bind_info.get(), aggr_state.arena_allocator);
	for (idx_t i = 0; i < count; ++i) {
		sel.set_index(0, i);
		for (const auto struct_idx : structs) {
			arg_cursor.data[struct_idx].Slice(arg_chunk.data[struct_idx], sel, 1);
		}
		if (filter_mask.RowIsValid(i) && distinct_mask.RowIsValid(i)) {
			aggregate.update(arg_cursor.data.data(), aggr_input_data, arg_cursor.ColumnCount(), statev, 1);
		}
		aggregate.finalize(statev, aggr_input_data, result, 1, i);
	}
}